

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
          (QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *this,int *key,
          QMap<int,_QSpanCollection::Span_*> *value)

{
  long lVar1;
  bool bVar2;
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *in_RDI;
  long in_FS_OFFSET;
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_> copy;
  iterator in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  key_type *in_stack_ffffffffffffffd0;
  map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>
  *this_00;
  iterator local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>
             *)&DAT_aaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
          ::isShared(&in_RDI->d);
  if (bVar2) {
    QMap(in_RDI,(QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_stack_ffffffffffffff98._M_node)
    ;
  }
  else {
    memset(&stack0xffffffffffffffd8,0,8);
    QMap((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)0x8c3112);
  }
  detach(in_RDI);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
                *)0x8c3126);
  std::
  map<int,QMap<int,QSpanCollection::Span*>,std::less<int>,std::allocator<std::pair<int_const,QMap<int,QSpanCollection::Span*>>>>
  ::insert_or_assign<QMap<int,QSpanCollection::Span*>const&>
            (this_00,in_stack_ffffffffffffffd0,
             (QMap<int,_QSpanCollection::Span_*> *)
             CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  iterator::iterator((iterator *)0x8c3170,in_stack_ffffffffffffff98);
  ~QMap((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)0x8c317a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)(iterator)local_20._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }